

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int local_26c;
  string local_268 [32];
  string local_248 [8];
  string cmd;
  long local_218;
  ifstream fin;
  
  std::ifstream::ifstream(&local_218,(string *)FILEPATH_abi_cxx11_,_S_bin);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if (bVar1) {
    std::istream::read((char *)&local_218,0x10c218);
    std::istream::read((char *)&local_218,0x10e220);
    std::istream::read((char *)&local_218,0x12e220);
  }
  else {
    initialize();
  }
  std::ifstream::close();
  do {
    std::__cxx11::string::string(local_248);
    std::operator<<((ostream *)&std::cout,">>");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_248);
    std::__cxx11::string::string(local_268,local_248);
    operation((string *)local_268);
    std::__cxx11::string::~string(local_268);
    if ((flag & 1U) == 0) {
      local_26c = 3;
    }
    else {
      local_26c = 0;
    }
    std::__cxx11::string::~string(local_248);
  } while (local_26c == 0);
  std::ifstream::~ifstream(&local_218);
  return 0;
}

Assistant:

int main(){
    ifstream fin(FILEPATH, ios::binary);
    if (fin){
        fin.read((char *)&super_block, sizeof(Super_Block));
        fin.read((char *)inodes, sizeof(inodes));
        fin.read((char *)emptyspaces, sizeof(emptyspaces));
    }
    else{
        initialize();
    }
    fin.close();
    while(1){
        string cmd;
        cout << ">>";
        getline (cin, cmd);
        operation(cmd);
        if(!flag)break;
    }
    return 0;
}